

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescendentFontWriter.cpp
# Opt level: O3

void __thiscall
DescendentFontWriter::WriteWidths
          (DescendentFontWriter *this,UIntAndGlyphEncodingInfoVector *inEncodedGlyphs,
          DictionaryContext *inFontContext)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  unsigned_short inLastCID;
  pointer ppVar4;
  pointer ppVar5;
  FTPosList widthsList;
  bool local_5b;
  unsigned_short local_5a;
  FTPosList local_50;
  _List_node_base *local_38;
  
  ppVar4 = (inEncodedGlyphs->
           super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&local_50;
  local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&local_50;
  DictionaryContext::WriteKey(inFontContext,&scDW_abi_cxx11_);
  local_38 = (_List_node_base *)FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar4->first);
  DictionaryContext::WriteIntegerValue(inFontContext,(longlong)local_38);
  do {
    ppVar5 = ppVar4;
    ppVar4 = ppVar5 + 1;
    if (ppVar4 == (inEncodedGlyphs->
                  super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      inLastCID = 0;
      goto LAB_00203fd5;
    }
    p_Var1 = (_List_node_base *)FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar4->first);
  } while (p_Var1 == local_38);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = p_Var1;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size =
       local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size + 1;
  inLastCID = ppVar5[1].second.mEncodedCharacter;
LAB_00203fd5:
  p_Var1 = local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size != 0) {
    DictionaryContext::WriteKey(inFontContext,&scW_abi_cxx11_);
    ObjectsContext::StartArray(this->mObjectsContext);
    ppVar5 = ppVar5 + 2;
    local_5a = inLastCID;
    if (ppVar5 == (inEncodedGlyphs->
                  super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      local_5b = true;
    }
    else {
      local_5b = true;
      do {
        p_Var1 = (_List_node_base *)
                 FreeTypeFaceWrapper::GetGlyphWidth(this->mFontInfo,ppVar5->first);
        if (p_Var1 != local_38) {
          if (inLastCID + 1 == (uint)(ppVar5->second).mEncodedCharacter) {
            p_Var2 = local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                     super__List_node_base._M_next[1]._M_next;
            p_Var3 = (_List_node_base *)operator_new(0x18);
            local_5b = (bool)(local_5b & p_Var2 == p_Var1);
            inLastCID = inLastCID + 1;
            p_Var3[1]._M_next = p_Var1;
            std::__detail::_List_node_base::_M_hook(p_Var3);
            local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size =
                 local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size + 1;
          }
          else {
            WriteWidthsItem(this,local_5b,&local_50,local_5a,inLastCID);
            p_Var2 = local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
                     super__List_node_base._M_next;
            while (p_Var2 != (_List_node_base *)&local_50) {
              p_Var3 = (((_List_base<long,_std::allocator<long>_> *)&p_Var2->_M_next)->_M_impl).
                       _M_node.super__List_node_base._M_next;
              operator_delete(p_Var2,0x18);
              p_Var2 = p_Var3;
            }
            local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
            local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
            super__List_node_base._M_next = (_List_node_base *)&local_50;
            local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
            super__List_node_base._M_prev = (_List_node_base *)&local_50;
            p_Var2 = (_List_node_base *)operator_new(0x18);
            p_Var2[1]._M_next = p_Var1;
            std::__detail::_List_node_base::_M_hook(p_Var2);
            local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size =
                 local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size + 1;
            inLastCID = (ppVar5->second).mEncodedCharacter;
            local_5b = true;
            local_5a = inLastCID;
          }
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != (inEncodedGlyphs->
                         super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size != 0) {
      WriteWidthsItem(this,local_5b,&local_50,local_5a,inLastCID);
    }
    ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
    p_Var1 = local_50.super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
             super__List_node_base._M_next;
  }
  while (p_Var1 != (_List_node_base *)&local_50) {
    p_Var2 = p_Var1->_M_next;
    operator_delete(p_Var1,0x18);
    p_Var1 = p_Var2;
  }
  return;
}

Assistant:

void DescendentFontWriter::WriteWidths(const UIntAndGlyphEncodingInfoVector& inEncodedGlyphs,
										  DictionaryContext* inFontContext)
{
	UIntAndGlyphEncodingInfoVector::const_iterator it = inEncodedGlyphs.begin(); // will be the 0 glyph
	FT_Pos defaultWidth;
	FTPosList widthsList;
	bool allWidthsSame = true;
	FT_Pos currentWidth;
	unsigned short firstCIDInList = 0;
	unsigned short previousCIDInList = 0;

	// DW
	inFontContext->WriteKey(scDW);
	defaultWidth = mFontInfo->GetGlyphWidth(it->first);
	inFontContext->WriteIntegerValue(defaultWidth);

	++it;

	// find the first which is not default width
	for(; it != inEncodedGlyphs.end();++it)
	{
		currentWidth =  mFontInfo->GetGlyphWidth(it->first);
		if(currentWidth != defaultWidth)
		{
			widthsList.push_back(currentWidth);
			firstCIDInList = it->second.mEncodedCharacter;
			previousCIDInList = it->second.mEncodedCharacter;
			break;
		}
	}

	if(widthsList.size() != 0)
	{
		++it; // promote the iterator, from the already recorded glyph

		// W
		inFontContext->WriteKey(scW);
		mObjectsContext->StartArray();

		for(; it != inEncodedGlyphs.end();++it)
		{
			currentWidth = mFontInfo->GetGlyphWidth(it->first);
            if(currentWidth != defaultWidth)
			{
				if(it->second.mEncodedCharacter == previousCIDInList + 1)
				{
					++previousCIDInList;
					allWidthsSame &= (widthsList.front() == currentWidth);
					widthsList.push_back(currentWidth);
				}
				else
				{
					WriteWidthsItem(allWidthsSame,widthsList,firstCIDInList,previousCIDInList);
					widthsList.clear();
					widthsList.push_back(currentWidth);
					allWidthsSame = true;
					firstCIDInList = it->second.mEncodedCharacter;
					previousCIDInList = it->second.mEncodedCharacter;
				}

			}
			
		}
		if(widthsList.size() > 0)
			WriteWidthsItem(allWidthsSame,widthsList,firstCIDInList,previousCIDInList);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
	}
}